

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O0

void sum_overload_function(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  StringRef capturedExpression;
  int iVar1;
  undefined8 *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  int value3;
  int value2;
  int value1;
  AssertionHandler catchAssertionHandler;
  undefined4 in_stack_fffffffffffffef8;
  Flags in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  AssertionHandler *this;
  StringRef *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar2;
  undefined4 in_stack_ffffffffffffff18;
  int iVar3;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  ExprLhs<const_int_&> *in_stack_ffffffffffffff28;
  AssertionHandler local_80;
  undefined8 *local_18;
  int local_c;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_80.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 (in_stack_ffffffffffffff00,
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  this = &local_80;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
             ,199);
  Catch::StringRef::StringRef
            ((StringRef *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (char *)in_stack_ffffffffffffff08);
  capturedExpression.m_start._4_4_ = in_stack_ffffffffffffff1c;
  capturedExpression.m_start._0_4_ = in_stack_ffffffffffffff18;
  capturedExpression.m_size._0_4_ = in_stack_ffffffffffffff20;
  capturedExpression.m_size._4_4_ = in_stack_ffffffffffffff24;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08,(SourceLineInfo *)this,capturedExpression,
             in_stack_fffffffffffffefc);
  Catch::Decomposer::operator<=
            ((Decomposer *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (int *)0x22d70d);
  Catch::ExprLhs<int_const&>::operator>
            (in_stack_ffffffffffffff28,(int *)((ulong)in_stack_ffffffffffffff24 << 0x20));
  Catch::AssertionHandler::handleExpr
            (this,(ITransientExpression *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x22d75a);
  Catch::AssertionHandler::complete(this);
  Catch::AssertionHandler::~AssertionHandler(this);
  iVar3 = 0;
  iVar2 = 0;
  iVar1 = duckdb_shell_sqlite3_value_int(*local_18);
  if (local_c == 2) {
    iVar3 = duckdb_shell_sqlite3_value_int(local_18[1]);
  }
  else if (local_c == 3) {
    iVar3 = duckdb_shell_sqlite3_value_int(local_18[1]);
    iVar2 = duckdb_shell_sqlite3_value_int(local_18[2]);
  }
  duckdb_shell_sqlite3_result_int(local_8,iVar1 + iVar3 + iVar2);
  return;
}

Assistant:

static void sum_overload_function(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc > 0);
	int value1, value2, value3;
	value2 = 0;
	value3 = 0;
	value1 = sqlite3_value_int(argv[0]);
	if (argc == 2) {
		value2 = sqlite3_value_int(argv[1]);
	} else if (argc == 3) {
		value2 = sqlite3_value_int(argv[1]);
		value3 = sqlite3_value_int(argv[2]);
	}

	sqlite3_result_int(context, value1 + value2 + value3);
}